

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_grzip.c
# Opt level: O0

int grzip_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  long local_30;
  ssize_t avail;
  uchar *p;
  archive_read_filter *filter_local;
  archive_read_filter_bidder *self_local;
  
  p = (uchar *)filter;
  filter_local = (archive_read_filter *)self;
  avail = (ssize_t)__archive_read_filter_ahead(filter,0xc,&local_30);
  if (((void *)avail == (void *)0x0) || (local_30 == 0)) {
    self_local._4_4_ = 0;
  }
  else {
    iVar1 = memcmp((void *)avail,"GRZipII",0xc);
    if (iVar1 == 0) {
      self_local._4_4_ = 0x60;
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
grzip_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail;

	(void)self; /* UNUSED */

	p = __archive_read_filter_ahead(filter, sizeof(grzip_magic), &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, grzip_magic, sizeof(grzip_magic)))
		return (0);

	return (sizeof(grzip_magic) * 8);
}